

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

secplane_t * P_CheckSlopeWalk(AActor *actor,DVector2 *move)

{
  uint uVar1;
  int iVar2;
  sector_t *psVar3;
  sector_t *psVar4;
  long lVar5;
  double *pdVar6;
  msecnode_t *pmVar7;
  sector_t_conflict *psVar8;
  double dVar9;
  double dVar10;
  ulong uVar11;
  secplane_t *psVar12;
  secplane_t *psVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  if (P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane == '\0') {
    P_CheckSlopeWalk();
  }
  uVar1 = (actor->flags).Value;
  if ((uVar1 >> 9 & 1) == 0) {
    psVar3 = actor->floorsector;
    dVar9 = (actor->__Pos).X;
    dVar10 = (actor->__Pos).Y;
    psVar4 = actor->Sector;
    iVar2 = psVar4->PortalGroup;
    dVar16 = 0.0;
    dVar17 = 0.0;
    if (iVar2 != psVar3->PortalGroup) {
      dVar16 = Displacements.data.Array[psVar3->PortalGroup * Displacements.size + iVar2].pos.X;
      dVar17 = Displacements.data.Array[psVar3->PortalGroup * Displacements.size + iVar2].pos.Y;
    }
    dVar15 = ((psVar3->floorplane).normal.Y * (dVar17 + dVar10) +
             (psVar3->floorplane).D + (psVar3->floorplane).normal.X * (dVar16 + dVar9)) *
             (psVar3->floorplane).negiC;
    psVar12 = &psVar3->floorplane;
    uVar11 = (ulong)(psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar11 != 0) {
      lVar14 = 0;
      do {
        lVar5 = *(long *)((long)(psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                Array + lVar14);
        if ((~*(uint *)(lVar5 + 0x58) & 3) == 0) {
          pdVar6 = *(double **)(lVar5 + 0x28);
          dVar18 = *pdVar6;
          dVar21 = pdVar6[1];
          dVar19 = ((dVar17 + dVar10) * dVar21 + pdVar6[3] + (dVar16 + dVar9) * dVar18) * pdVar6[4];
          if ((dVar15 < dVar19) && (dVar19 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
            P_CheckSlopeWalk::copyplane.normal.Z = pdVar6[2];
            P_CheckSlopeWalk::copyplane.D = pdVar6[3];
            P_CheckSlopeWalk::copyplane.negiC = pdVar6[4];
            P_CheckSlopeWalk::copyplane.normal.X = dVar18;
            P_CheckSlopeWalk::copyplane.normal.Y = dVar21;
            if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
              P_CheckSlopeWalk::copyplane.normal.X = -dVar18;
              P_CheckSlopeWalk::copyplane.normal.Y = -dVar21;
              P_CheckSlopeWalk::copyplane.normal.Z = -P_CheckSlopeWalk::copyplane.normal.Z;
              P_CheckSlopeWalk::copyplane.D = -P_CheckSlopeWalk::copyplane.D;
              P_CheckSlopeWalk::copyplane.negiC = -P_CheckSlopeWalk::copyplane.negiC;
            }
            psVar12 = &P_CheckSlopeWalk::copyplane;
            dVar15 = dVar19;
          }
        }
        lVar14 = lVar14 + 8;
      } while (uVar11 << 3 != lVar14);
    }
    psVar13 = psVar12;
    if (psVar3 != psVar4) {
      uVar11 = (ulong)(psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar11 != 0) {
        lVar14 = 0;
        do {
          lVar5 = *(long *)((long)(psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                  Array + lVar14);
          if ((~*(uint *)(lVar5 + 0x58) & 3) == 0) {
            pdVar6 = *(double **)(lVar5 + 0x28);
            dVar16 = *pdVar6;
            dVar17 = pdVar6[1];
            dVar18 = (dVar10 * dVar17 + pdVar6[3] + dVar9 * dVar16) * pdVar6[4];
            if ((dVar15 < dVar18) && (dVar18 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
              P_CheckSlopeWalk::copyplane.normal.Z = pdVar6[2];
              P_CheckSlopeWalk::copyplane.D = pdVar6[3];
              P_CheckSlopeWalk::copyplane.negiC = pdVar6[4];
              P_CheckSlopeWalk::copyplane.normal.X = dVar16;
              P_CheckSlopeWalk::copyplane.normal.Y = dVar17;
              if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
                P_CheckSlopeWalk::copyplane.normal.X = -dVar16;
                P_CheckSlopeWalk::copyplane.normal.Y = -dVar17;
                P_CheckSlopeWalk::copyplane.normal.Z = -P_CheckSlopeWalk::copyplane.normal.Z;
                P_CheckSlopeWalk::copyplane.D = -P_CheckSlopeWalk::copyplane.D;
                P_CheckSlopeWalk::copyplane.negiC = -P_CheckSlopeWalk::copyplane.negiC;
              }
              psVar12 = &P_CheckSlopeWalk::copyplane;
              dVar15 = dVar18;
            }
          }
          lVar14 = lVar14 + 8;
        } while (uVar11 << 3 != lVar14);
      }
      psVar13 = (secplane_t *)0x0;
      if (actor->floorz + 4.0 < dVar15) {
        return (secplane_t *)0x0;
      }
    }
    dVar16 = (actor->__Pos).Z;
    if (dVar16 - dVar15 <= 1.0) {
      dVar17 = (psVar12->normal).X;
      dVar18 = (psVar12->normal).Y;
      if ((((dVar17 != 0.0) || (NAN(dVar17))) || (dVar18 != 0.0)) || (NAN(dVar18))) {
        dVar19 = dVar9 + move->X;
        dVar20 = dVar10 + move->Y;
        dVar21 = (psVar12->normal).Z;
        dVar22 = dVar16 * dVar21 + dVar18 * dVar20 + dVar17 * dVar19 + psVar12->D;
        if (0.0 <= dVar22) {
          if (1.52587890625e-05 <= ABS(dVar16 - dVar15)) {
            return (secplane_t *)0x0;
          }
          if (dVar22 <= 0.0) {
            return (secplane_t *)0x0;
          }
          dVar19 = dVar19 + dVar17 * dVar22;
          dVar20 = dVar20 + dVar18 * dVar22;
        }
        else {
          if (dVar21 < 0.707122802734375) {
            if ((uVar1 >> 0xc & 1) != 0) {
              return psVar13;
            }
            if (0.4714152018229167 < dVar21) {
              for (pmVar7 = actor->touching_sectorlist; pmVar7 != (msecnode_t *)0x0;
                  pmVar7 = pmVar7->m_tnext) {
                psVar8 = pmVar7->m_sector;
                if (0.707122802734375 <= (psVar8->floorplane).normal.Z) {
                  dVar15 = 0.0;
                  dVar21 = 0.0;
                  if (iVar2 != psVar8->PortalGroup) {
                    dVar15 = Displacements.data.Array
                             [psVar8->PortalGroup * Displacements.size + iVar2].pos.X;
                    dVar21 = Displacements.data.Array
                             [psVar8->PortalGroup * Displacements.size + iVar2].pos.Y;
                  }
                  if (dVar16 - actor->MaxStepHeight <=
                      ((psVar8->floorplane).normal.Y * (dVar21 + dVar10 + move->Y) +
                      (psVar8->floorplane).D +
                      (psVar8->floorplane).normal.X * (dVar15 + dVar9 + move->X)) *
                      (psVar8->floorplane).negiC) {
                    return psVar13;
                  }
                }
              }
            }
            move->X = dVar17 + dVar17;
            move->Y = dVar18 + dVar18;
            (actor->Vel).X = dVar17 + dVar17;
            (actor->Vel).Y = dVar18 + dVar18;
            return psVar13;
          }
          dVar19 = dVar19 - dVar17 * dVar22;
          dVar20 = dVar20 - dVar18 * dVar22;
        }
        move->X = dVar19 - dVar9;
        move->Y = dVar20 - dVar10;
        return psVar13;
      }
    }
  }
  return (secplane_t *)0x0;
}

Assistant:

const secplane_t * P_CheckSlopeWalk(AActor *actor, DVector2 &move)
{
	static secplane_t copyplane;
	if (actor->flags & MF_NOGRAVITY)
	{
		return NULL;
	}

	DVector3 pos = actor->PosRelative(actor->floorsector);
	const secplane_t *plane = &actor->floorsector->floorplane;
	double planezhere = plane->ZatPoint(pos);

	for (auto rover : actor->floorsector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		double thisplanez = rover->top.plane->ZatPoint(pos);

		if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
		{
			copyplane = *rover->top.plane;
			if (copyplane.fC() < 0) copyplane.FlipVert();
			plane = &copyplane;
			planezhere = thisplanez;
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		for (auto rover : actor->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double thisplanez = rover->top.plane->ZatPoint(actor);

			if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
			{
				copyplane = *rover->top.plane;
				if (copyplane.fC() < 0) copyplane.FlipVert();
				plane = &copyplane;
				planezhere = thisplanez;
			}
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		// this additional check prevents sliding on sloped dropoffs
		if (planezhere>actor->floorz + 4)
			return NULL;
	}

	if (actor->Z() - planezhere > 1)
	{ // not on floor
		return NULL;
	}

	if (plane->isSlope())
	{
		DVector2 dest;
		double t;

		dest = actor->Pos() + move;
		t = (plane->Normal() | DVector3(dest, actor->Z())) + plane->fD();
		if (t < 0)
		{ // Desired location is behind (below) the plane
			// (i.e. Walking up the plane)
			if (plane->fC() < STEEPSLOPE)
			{ // Can't climb up slopes of ~45 degrees or more
				if (actor->flags & MF_NOCLIP)
				{
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
				else
				{
					const msecnode_t *node;
					bool dopush = true;

					if (plane->fC() > STEEPSLOPE * 2 / 3)
					{
						for (node = actor->touching_sectorlist; node; node = node->m_tnext)
						{
							sector_t *sec = node->m_sector;
							if (sec->floorplane.fC() >= STEEPSLOPE)
							{
								DVector3 pos = actor->PosRelative(sec) +move;

								if (sec->floorplane.ZatPoint(pos) >= actor->Z() - actor->MaxStepHeight)
								{
									dopush = false;
									break;
								}
							}
						}
					}
					if (dopush)
					{
						move = plane->Normal() * 2;
						actor->Vel.X = move.X;
						actor->Vel.Y = move.Y;
					}
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
			}
			// Slide the desired location along the plane's normal
			// so that it lies on the plane's surface
			dest -= plane->Normal() * t;
			move = dest - actor->Pos().XY();
			return (actor->floorsector == actor->Sector) ? plane : NULL;
		}
		else if (t > 0)
		{ // Desired location is in front of (above) the plane
			if (actor->isAtZ(planezhere))	// it is very important not to be too precise here.
			{ 
				// Actor's current spot is on/in the plane, so walk down it
				// Same principle as walking up, except reversed
				dest += plane->Normal() * t;
				move = dest - actor->Pos().XY();
				return (actor->floorsector == actor->Sector) ? plane : NULL;
			}
		}
	}
	return NULL;
}